

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_rebels.cpp
# Opt level: O2

int AF_A_ShootGun(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  AActor *ent;
  char *__assertion;
  FName local_5c;
  FName local_58;
  FSoundID local_54;
  DAngle local_50;
  DAngle local_48;
  undefined8 local_40;
  AActor *local_38;
  DAngle local_30;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054d680;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_0054d4c6:
        ent = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0054d680;
        }
      }
      if (numparam == 1) goto LAB_0054d546;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0054d670;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0054d680;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0054d670;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054d546:
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)&ent->target);
        if (pAVar4 != (AActor *)0x0) {
          local_54.ID = S_FindSound("monsters/rifle");
          S_Sound(ent,1,&local_54,1.0,1.0);
          A_FaceTarget(ent);
          local_38 = (AActor *)(ent->Angles).Yaw.Degrees;
          local_40 = 0;
          P_AimLineAttack((AActor *)&stack0xffffffffffffffd0,(DAngle *)ent,2048.0,
                          (FTranslatedLineTarget *)&local_38,(DAngle *)0x0,(int)&local_40,
                          (AActor *)0x0,(AActor *)0x0);
          iVar3 = FRandom::Random2(&pr_shootgun);
          local_48.Degrees = (double)iVar3 * 0.0439453125 + (ent->Angles).Yaw.Degrees;
          local_50.Degrees = local_30.Degrees;
          iVar3 = FRandom::operator()(&pr_shootgun);
          local_58.Index = 200;
          local_5c.Index = 0x41;
          P_LineAttack(ent,&local_48,2048.0,&local_50,(iVar3 % 5) * 3 + 3,&local_58,&local_5c,0,
                       (FTranslatedLineTarget *)0x0,(int *)0x0);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0054d680;
    }
    if (ent == (AActor *)0x0) goto LAB_0054d4c6;
  }
LAB_0054d670:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0054d680:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_rebels.cpp"
                ,0x19,"int AF_A_ShootGun(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ShootGun)
{
	PARAM_ACTION_PROLOGUE;

	DAngle pitch;

	if (self->target == NULL)
		return 0;

	S_Sound (self, CHAN_WEAPON, "monsters/rifle", 1, ATTN_NORM);
	A_FaceTarget (self);
	pitch = P_AimLineAttack (self, self->Angles.Yaw, MISSILERANGE);
	P_LineAttack (self, self->Angles.Yaw + pr_shootgun.Random2() * (11.25 / 256),
		MISSILERANGE, pitch,
		3*(pr_shootgun() % 5 + 1), NAME_Hitscan, NAME_StrifePuff);
	return 0;
}